

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O2

BadNameString * CLI::BadNameString::MissingDash(BadNameString *__return_storage_ptr__,string *name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  ::std::operator+(&local_30,"Long names strings require 2 dashes ",name);
  BadNameString(__return_storage_ptr__,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

static BadNameString MissingDash(std::string name) {
        return BadNameString("Long names strings require 2 dashes " + name);
    }